

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildStructDeclaratorList(CNscPStackEntry *pList,CNscPStackEntry *pDeclarator)

{
  if (pList == (CNscPStackEntry *)0x0) {
    pList = CNscContext::GetPStackEntryInt(g_pCtx);
    CNscPStackEntry::SetType(pList,NscType_Unknown);
  }
  if (pList->m_nType != NscType_Error) {
    CNscPStackEntry::PushDeclaration
              (pList,pDeclarator->m_pszId,NscType_Unknown,(uchar *)0x0,0,g_pCtx->m_anFileNumbers[0],
               g_pCtx->m_anLineNumbers[0],0);
  }
  CNwnDoubleLinkList::InsertAfter(&pDeclarator->m_link,&g_pCtx->m_listEntryFree);
  return pList;
}

Assistant:

YYSTYPE NscBuildStructDeclaratorList (YYSTYPE pList, YYSTYPE pDeclarator)
{
	CNscPStackEntry *pOut = pList;

	//
	// If there isn't an list, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// Process the parameter
	//

	if (pOut ->GetType () != NscType_Error)
	{
		pOut ->PushDeclaration (pDeclarator ->GetIdentifier (),
			NscType_Unknown, NULL, 0, g_pCtx ->GetFile (0),
			g_pCtx ->GetLine (0), 0);
	}
	g_pCtx ->FreePStackEntry (pDeclarator);


	//
	// Return the new expression
	//

	return pOut;
}